

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2convex_hull_query.cc
# Opt level: O0

void __thiscall S2ConvexHullQuery::AddLoop(S2ConvexHullQuery *this,S2Loop *loop)

{
  bool bVar1;
  int iVar2;
  S2Point *__x;
  int local_78;
  int i;
  S2LatLngRect local_68;
  S2LatLngRect local_40;
  S2Loop *local_18;
  S2Loop *loop_local;
  S2ConvexHullQuery *this_local;
  
  local_18 = loop;
  loop_local = (S2Loop *)this;
  S2Loop::GetRectBound(&local_68,loop);
  S2LatLngRect::Union(&local_40,&this->bound_,&local_68);
  S2LatLngRect::operator=(&this->bound_,&local_40);
  S2LatLngRect::~S2LatLngRect(&local_40);
  S2LatLngRect::~S2LatLngRect(&local_68);
  bVar1 = S2Loop::is_empty_or_full(local_18);
  if (!bVar1) {
    for (local_78 = 0; iVar2 = S2Loop::num_vertices(local_18), local_78 < iVar2;
        local_78 = local_78 + 1) {
      __x = S2Loop::vertex(local_18,local_78);
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back(&this->points_,__x)
      ;
    }
  }
  return;
}

Assistant:

void S2ConvexHullQuery::AddLoop(const S2Loop& loop) {
  bound_ = bound_.Union(loop.GetRectBound());
  if (loop.is_empty_or_full()) {
    // The empty and full loops consist of a single fake "vertex" that should
    // not be added to our point collection.
    return;
  }
  for (int i = 0; i < loop.num_vertices(); ++i) {
    points_.push_back(loop.vertex(i));
  }
}